

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O0

wchar_t archive_compressor_compress_close(archive_write_filter *f)

{
  wchar_t wVar1;
  wchar_t wVar2;
  archive_write_filter *in_RDI;
  wchar_t ret2;
  wchar_t ret;
  private_data_conflict3 *state;
  uint in_stack_ffffffffffffffe8;
  void *buff;
  
  buff = in_RDI->data;
  wVar1 = output_code((archive_write_filter *)state,ret);
  if ((wVar1 == L'\0') && (wVar1 = output_flush(in_RDI), wVar1 == L'\0')) {
    wVar1 = __archive_write_filter(in_RDI,buff,(ulong)in_stack_ffffffffffffffe8);
  }
  wVar2 = __archive_write_close_filter
                    ((archive_write_filter *)CONCAT44(wVar1,in_stack_ffffffffffffffe8));
  if (wVar2 < wVar1) {
    wVar1 = wVar2;
  }
  free(*(void **)((long)buff + 0x65178));
  free(buff);
  return wVar1;
}

Assistant:

static int
archive_compressor_compress_close(struct archive_write_filter *f)
{
	struct private_data *state = (struct private_data *)f->data;
	int ret, ret2;

	ret = output_code(f, state->cur_code);
	if (ret != ARCHIVE_OK)
		goto cleanup;
	ret = output_flush(f);
	if (ret != ARCHIVE_OK)
		goto cleanup;

	/* Write the last block */
	ret = __archive_write_filter(f->next_filter,
	    state->compressed, state->compressed_offset);
cleanup:
	ret2 = __archive_write_close_filter(f->next_filter);
	if (ret > ret2)
		ret = ret2;
	free(state->compressed);
	free(state);
	return (ret);
}